

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O1

bool __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::AddChunk
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t capacity)

{
  SharedData *pSVar1;
  CrtAllocator *pCVar2;
  ChunkHeader *pCVar3;
  
  if (this->baseAllocator_ == (CrtAllocator *)0x0) {
    pCVar2 = (CrtAllocator *)operator_new(1);
    this->baseAllocator_ = pCVar2;
    this->shared_->ownBaseAllocator = pCVar2;
  }
  if (capacity + 0x18 == 0) {
    pCVar3 = (ChunkHeader *)0x0;
  }
  else {
    pCVar3 = (ChunkHeader *)malloc(capacity + 0x18);
  }
  if (pCVar3 != (ChunkHeader *)0x0) {
    pCVar3->capacity = capacity;
    pCVar3->size = 0;
    pSVar1 = this->shared_;
    pCVar3->next = pSVar1->chunkHead;
    pSVar1->chunkHead = pCVar3;
  }
  return pCVar3 != (ChunkHeader *)0x0;
}

Assistant:

bool AddChunk(size_t capacity) {
        if (!baseAllocator_)
            shared_->ownBaseAllocator = baseAllocator_ = RAPIDJSON_NEW(BaseAllocator)();
        if (ChunkHeader* chunk = static_cast<ChunkHeader*>(baseAllocator_->Malloc(SIZEOF_CHUNK_HEADER + capacity))) {
            chunk->capacity = capacity;
            chunk->size = 0;
            chunk->next = shared_->chunkHead;
            shared_->chunkHead = chunk;
            return true;
        }
        else
            return false;
    }